

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction.cc
# Opt level: O2

bool __thiscall
sptk::AperiodicityExtraction::Run
          (AperiodicityExtraction *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  double dVar8;
  undefined1 auVar9 [16];
  vector<double,_std::allocator<double>_> length_fixed_f0;
  allocator_type local_61;
  _Vector_base<double,_std::allocator<double>_> local_60;
  double local_48;
  double dStack_40;
  
  if ((this->aperiodicity_extraction_ != (AperiodicityExtractionInterface *)0x0) &&
     (iVar1 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[3])(),
     (char)iVar1 != '\0')) {
    lVar3 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    lVar4 = lVar3 >> 3;
    auVar9._8_4_ = (int)(lVar3 >> 0x23);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    dStack_40 = auVar9._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    iVar1 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[2])();
    dVar8 = ceil(local_48 / (double)iVar1);
    uVar5 = (uint)dVar8;
    uVar6 = (uint)((ulong)((long)(f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    if (uVar5 != uVar6) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,(long)(int)uVar5,&local_61);
      uVar2 = uVar5;
      if ((int)uVar6 < (int)uVar5) {
        uVar2 = uVar6;
      }
      if (uVar2 != 0) {
        memmove(local_60._M_impl.super__Vector_impl_data._M_start,
                (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,(long)(int)uVar2 << 3);
      }
      if ((0 < (int)uVar6) && ((int)uVar6 < (int)uVar5)) {
        dVar8 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish[-1];
        for (pdVar7 = local_60._M_impl.super__Vector_impl_data._M_start + (uVar6 & 0x7fffffff);
            pdVar7 != local_60._M_impl.super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
          *pdVar7 = dVar8;
        }
      }
      iVar1 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[4])
                        (this->aperiodicity_extraction_,waveform,&local_60,aperiodicity);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      return (bool)(char)iVar1;
    }
    iVar1 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[4])
                      (this->aperiodicity_extraction_,waveform,f0,aperiodicity);
    return SUB41(iVar1,0);
  }
  return false;
}

Assistant:

bool AperiodicityExtraction::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  if (!IsValid()) {
    return false;
  }

  const int target_f0_length(
      static_cast<int>(std::ceil(static_cast<double>(waveform.size()) /
                                 aperiodicity_extraction_->GetFrameShift())));
  const int given_f0_length(static_cast<int>(f0.size()));
  if (target_f0_length == given_f0_length) {
    return aperiodicity_extraction_->Run(waveform, f0, aperiodicity);
  }

  std::vector<double> length_fixed_f0(target_f0_length);
  std::copy(f0.begin(),
            f0.begin() + std::min(target_f0_length, given_f0_length),
            length_fixed_f0.begin());
  if (1 <= given_f0_length && given_f0_length < target_f0_length) {
    std::fill(length_fixed_f0.begin() + given_f0_length, length_fixed_f0.end(),
              f0.back());
  }
  return aperiodicity_extraction_->Run(waveform, length_fixed_f0, aperiodicity);
}